

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostEmscripten.cpp
# Opt level: O2

void __thiscall wasm::PostEmscripten::optimizeExceptions(PostEmscripten *this,Module *module)

{
  size_t *this_00;
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  byte bVar4;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *imp;
  pointer puVar5;
  WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_> local_228;
  CallGraphPropertyAnalysis<Info> *local_120;
  size_t *local_118;
  undefined1 local_110 [8];
  CallGraphPropertyAnalysis<Info> analyzer;
  FlatTable flatTable;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = 0;
  for (puVar5 = (module->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    bVar3 = anon_unknown_0::isInvoke
                      ((puVar5->_M_t).
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    bVar4 = bVar4 | bVar3;
  }
  if ((bVar4 != 0) &&
     (puVar2 = (module->tables).
               super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     puVar2 != (module->tables).
               super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)) {
    this_00 = &analyzer.map._M_t._M_impl.super__Rb_tree_header._M_node_count;
    TableUtils::FlatTable::FlatTable
              ((FlatTable *)this_00,module,
               (puVar2->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
               super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl);
    if ((char)flatTable.names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == '\x01') {
      flatTable.valid = false;
      flatTable._25_7_ = 0;
      wasm::ModuleUtils::CallGraphPropertyAnalysis<Info>::CallGraphPropertyAnalysis
                ((CallGraphPropertyAnalysis<Info> *)local_110,module,(Func *)&flatTable.valid);
      std::_Function_base::~_Function_base((_Function_base *)&flatTable.valid);
      local_98._M_unused._M_object = (void *)0x0;
      local_98._8_8_ = 0;
      local_80 = std::
                 _Function_handler<bool_(const_Info_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/PostEmscripten.cpp:286:7)>
                 ::_M_invoke;
      local_88 = std::
                 _Function_handler<bool_(const_Info_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/PostEmscripten.cpp:286:7)>
                 ::_M_manager;
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      local_60 = std::
                 _Function_handler<bool_(const_Info_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/PostEmscripten.cpp:287:7)>
                 ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(const_Info_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/PostEmscripten.cpp:287:7)>
                 ::_M_manager;
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      local_40 = std::
                 _Function_handler<void_(Info_&,_wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/PostEmscripten.cpp:288:7)>
                 ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(Info_&,_wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/PostEmscripten.cpp:288:7)>
                 ::_M_manager;
      wasm::ModuleUtils::CallGraphPropertyAnalysis<Info>::propagateBack
                ((CallGraphPropertyAnalysis<Info> *)local_110,
                 (function<bool_(const_Info_&)> *)&local_98,
                 (function<bool_(const_Info_&)> *)&local_78,
                 (function<void_(Info_&,_wasm::Function_*)> *)&local_58,NonDirectCallsHaveProperty);
      std::_Function_base::~_Function_base((_Function_base *)&local_58);
      std::_Function_base::~_Function_base((_Function_base *)&local_78);
      std::_Function_base::~_Function_base((_Function_base *)&local_98);
      local_228.super_Pass.name._M_dataplus._M_p = (pointer)&local_228.super_Pass.name.field_2;
      local_228.super_Pass.runner = (PassRunner *)0x0;
      local_228.super_Pass.name._M_string_length = 0;
      local_228.super_Pass.name.field_2._M_local_buf[0] = '\0';
      local_228.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
      super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.replacep =
           (Expression **)0x0;
      local_228.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
      super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.stack.usedFixed = 0;
      local_228.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
      super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.currModule =
           (Module *)0x0;
      local_228.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
      super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task,_std::allocator<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
      super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task,_std::allocator<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_228.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
      super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task,_std::allocator<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_228.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
      super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.currFunction =
           (Function *)0x0;
      local_228.super_Pass._vptr_Pass = (_func_int **)&PTR__WalkerPass_00e1ff68;
      local_120 = &analyzer;
      local_118 = this_00;
      WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>::run
                (&local_228,(this->super_Pass).runner,module);
      WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>::
      ~WalkerPass(&local_228);
      std::
      _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                   *)&analyzer);
    }
    std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
              ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)
               &analyzer.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return;
}

Assistant:

void optimizeExceptions(Module* module) {
    // First, check if this code even uses invokes.
    bool hasInvokes = false;
    for (auto& imp : module->functions) {
      if (isInvoke(imp.get())) {
        hasInvokes = true;
      }
    }
    if (!hasInvokes || module->tables.empty()) {
      return;
    }
    // Next, see if the Table is flat, which we need in order to see where
    // invokes go statically. (In dynamic linking, the table is not flat,
    // and we can't do this.)
    TableUtils::FlatTable flatTable(*module, *module->tables[0]);
    if (!flatTable.valid) {
      return;
    }
    // This code has exceptions. Find functions that definitely cannot throw,
    // and remove invokes to them.
    struct Info
      : public ModuleUtils::CallGraphPropertyAnalysis<Info>::FunctionInfo {
      bool canThrow = false;
    };
    ModuleUtils::CallGraphPropertyAnalysis<Info> analyzer(
      *module, [&](Function* func, Info& info) {
        if (func->imported()) {
          // Assume any import can throw. We may want to reduce this to just
          // longjmp/cxa_throw/etc.
          info.canThrow = true;
        }
      });

    // Assume a non-direct call might throw.
    analyzer.propagateBack(
      [](const Info& info) { return info.canThrow; },
      [](const Info& info) { return true; },
      [](Info& info, Function* reason) { info.canThrow = true; },
      analyzer.NonDirectCallsHaveProperty);

    // Apply the information.
    struct OptimizeInvokes : public WalkerPass<PostWalker<OptimizeInvokes>> {
      bool isFunctionParallel() override { return true; }

      std::unique_ptr<Pass> create() override {
        return std::make_unique<OptimizeInvokes>(map, flatTable);
      }

      std::map<Function*, Info>& map;
      TableUtils::FlatTable& flatTable;

      OptimizeInvokes(std::map<Function*, Info>& map,
                      TableUtils::FlatTable& flatTable)
        : map(map), flatTable(flatTable) {}

      void visitCall(Call* curr) {
        auto* target = getModule()->getFunction(curr->target);
        if (!isInvoke(target)) {
          return;
        }
        // The first operand is the function pointer index, which must be
        // constant if we are to optimize it statically.
        if (auto* index = curr->operands[0]->dynCast<Const>()) {
          size_t indexValue = index->value.geti32();
          if (indexValue >= flatTable.names.size()) {
            // UB can lead to indirect calls to invalid pointers.
            return;
          }
          auto actualTarget = flatTable.names[indexValue];
          if (actualTarget.isNull()) {
            // UB can lead to an indirect call of 0 or an index in which there
            // is no function name.
            return;
          }
          if (map[getModule()->getFunction(actualTarget)].canThrow) {
            return;
          }
          // This invoke cannot throw! Make it a direct call.
          curr->target = actualTarget;
          for (Index i = 0; i < curr->operands.size() - 1; i++) {
            curr->operands[i] = curr->operands[i + 1];
          }
          curr->operands.resize(curr->operands.size() - 1);
        }
      }
    };
    OptimizeInvokes(analyzer.map, flatTable).run(getPassRunner(), module);
  }